

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cpp
# Opt level: O0

UBool icu_63::operator==(StringPiece *x,StringPiece *y)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  char *__s1;
  char *__s2;
  char *p2;
  char *p;
  int32_t len;
  StringPiece *y_local;
  StringPiece *x_local;
  
  iVar1 = StringPiece::size(x);
  iVar2 = StringPiece::size(y);
  if (iVar1 == iVar2) {
    if (iVar1 == 0) {
      x_local._7_1_ = true;
    }
    else {
      __s1 = StringPiece::data(x);
      __s2 = StringPiece::data(y);
      iVar3 = iVar1 + -1;
      if (__s1[iVar3] == __s2[iVar3]) {
        iVar3 = memcmp(__s1,__s2,(long)iVar3);
        x_local._7_1_ = iVar3 == 0;
      }
      else {
        x_local._7_1_ = false;
      }
    }
  }
  else {
    x_local._7_1_ = false;
  }
  return x_local._7_1_;
}

Assistant:

U_EXPORT UBool U_EXPORT2
operator==(const StringPiece& x, const StringPiece& y) {
  int32_t len = x.size();
  if (len != y.size()) {
    return false;
  }
  if (len == 0) {
    return true;
  }
  const char* p = x.data();
  const char* p2 = y.data();
  // Test last byte in case strings share large common prefix
  --len;
  if (p[len] != p2[len]) return false;
  // At this point we can, but don't have to, ignore the last byte.
  return uprv_memcmp(p, p2, len) == 0;
}